

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor_tests.cpp
# Opt level: O1

bool __thiscall
remove_mark_csv_filter::operator()
          (remove_mark_csv_filter *this,staj_event *event,ser_context *param_2)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  
  if (event->event_type_ == key) {
    bVar3 = ::jsoncons::basic_staj_event<char>::
            get<std::basic_string_view<char,std::char_traits<char>>>(event);
    if ((bVar3._M_len == 4) && (iVar2 = bcmp(bVar3._M_str,"mark",4), iVar2 == 0)) {
      bVar1 = true;
      goto LAB_00326220;
    }
  }
  if (this->reject_next_ != true) {
    return true;
  }
  bVar1 = false;
LAB_00326220:
  this->reject_next_ = bVar1;
  return false;
}

Assistant:

bool operator()(const staj_event& event, const ser_context&) 
    {
        if (event.event_type()  == staj_event_type::key &&
            event.get<jsoncons::string_view>() == "mark")
        {
            reject_next_ = true;
            return false;
        }
        else if (reject_next_)
        {
            reject_next_ = false;
            return false;
        }
        else
        {
            return true;
        }
    }